

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O0

ssize_t __thiscall QXbmHandler::write(QXbmHandler *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined7 extraout_var;
  QString *in_stack_000000d8;
  QIODevice *in_stack_000000e0;
  QImage *in_stack_000000e8;
  
  QImageIOHandler::device(&this->super_QImageIOHandler);
  bVar1 = write_xbm_image(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

bool QXbmHandler::write(const QImage &image)
{
    return write_xbm_image(image, device(), fileName);
}